

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ab3c04::DirectoryObject::DirectoryObject
          (DirectoryObject *this,cmLocalGenerator *lg,string *config,
          TargetIndexMapType *targetIndexMap)

{
  cmGlobalGenerator *pcVar1;
  cmake *pcVar2;
  string *psVar3;
  string local_58;
  TargetIndexMapType *local_28;
  TargetIndexMapType *targetIndexMap_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  DirectoryObject *this_local;
  
  this->LG = lg;
  this->Config = config;
  this->TargetIndexMap = targetIndexMap;
  local_28 = targetIndexMap;
  targetIndexMap_local = (TargetIndexMapType *)config;
  config_local = (string *)lg;
  lg_local = (cmLocalGenerator *)this;
  pcVar1 = cmLocalGenerator::GetGlobalGenerator(lg);
  pcVar2 = cmGlobalGenerator::GetCMakeInstance(pcVar1);
  psVar3 = cmake::GetHomeDirectory_abi_cxx11_(pcVar2);
  std::__cxx11::string::string((string *)&this->TopSource,(string *)psVar3);
  pcVar1 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)config_local);
  pcVar2 = cmGlobalGenerator::GetCMakeInstance(pcVar1);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
  std::__cxx11::string::string((string *)&this->TopBuild,(string *)psVar3);
  std::__cxx11::string::string((string *)&local_58,(string *)&this->TopSource);
  BacktraceData::BacktraceData(&this->Backtraces,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

DirectoryObject::DirectoryObject(cmLocalGenerator const* lg,
                                 std::string const& config,
                                 TargetIndexMapType& targetIndexMap)
  : LG(lg)
  , Config(config)
  , TargetIndexMap(targetIndexMap)
  , TopSource(lg->GetGlobalGenerator()->GetCMakeInstance()->GetHomeDirectory())
  , TopBuild(
      lg->GetGlobalGenerator()->GetCMakeInstance()->GetHomeOutputDirectory())
  , Backtraces(this->TopSource)
{
}